

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleSignal.h
# Opt level: O0

int __thiscall
Simple::Lib::
ProtoSignal<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_Simple::Lib::CollectorDefault<char>_>
::SignalLink::unlink(SignalLink *this,char *__name)

{
  int extraout_EAX;
  SignalLink *this_local;
  
  std::
  function<char_(float,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  ::operator=(&this->function,(nullptr_t)0x0);
  if (this->next != (SignalLink *)0x0) {
    this->next->prev = this->prev;
  }
  if (this->prev != (SignalLink *)0x0) {
    this->prev->next = this->next;
  }
  decref(this);
  return extraout_EAX;
}

Assistant:

void
    unlink ()
    {
      function = nullptr;
      if (next)
        next->prev = prev;
      if (prev)
        prev->next = next;
      decref();
      // leave intact ->next, ->prev for stale iterators
    }